

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O3

cargo_validation_t *
cargo_create_validator
          (char *name,cargo_validation_f validator,cargo_validation_destroy_f destroy,
          cargo_type_t types,void *user)

{
  cargo_validation_t *pcVar1;
  
  if ((replaced_cargo_malloc == (cargo_malloc_f)0x0) ||
     (pcVar1 = (cargo_validation_t *)(*replaced_cargo_malloc)(0x30),
     pcVar1 == (cargo_validation_t *)0x0)) {
    pcVar1 = (cargo_validation_t *)calloc(1,0x30);
    if (pcVar1 == (cargo_validation_t *)0x0) {
      return (cargo_validation_t *)0x0;
    }
  }
  else {
    pcVar1->ref_count = 0;
    pcVar1->user = (void *)0x0;
    pcVar1->destroy = (cargo_validation_destroy_f)0x0;
    *(undefined8 *)&pcVar1->types = 0;
    pcVar1->name = (char *)0x0;
    pcVar1->validator = (cargo_validation_f)0x0;
  }
  pcVar1->name = name;
  pcVar1->validator = validator;
  pcVar1->destroy = destroy;
  pcVar1->types = types;
  pcVar1->user = user;
  return pcVar1;
}

Assistant:

cargo_validation_t *cargo_create_validator(const char *name,
                                           cargo_validation_f validator,
                                           cargo_validation_destroy_f destroy,
                                           cargo_type_t types,
                                           void *user)
{
    cargo_validation_t *v = NULL;

    if (!(v = _cargo_calloc(1, sizeof(cargo_validation_t))))
    {
        return NULL;
    }

    v->name = name;
    v->validator = validator;
    v->destroy = destroy;
    v->types = types;
    v->user = user;

    return v;
}